

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void dg::vr::RelationsAnalyzer::inferFromPreds
               (VRLocation *location,Handle lt,Relations known,Handle rt)

{
  pointer ppVVar1;
  VRLocation *pVVar2;
  VectorSet<const_llvm::Value_*> *pVVar3;
  iterator iVar4;
  _Base_bitset<1UL> _Var5;
  pointer ppVVar6;
  ValueRelations *this;
  size_t rtId;
  size_t ltId;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  setEqual;
  Value *local_a8;
  Value *local_a0;
  ValueRelations *local_98;
  _Base_bitset<1UL> local_90;
  ValueRelations *local_88;
  Handle local_80;
  Handle local_78;
  pointer local_70;
  pointer local_68;
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  local_60;
  
  local_90._M_w = (_WordT)known.bits.super__Base_bitset<1UL>._M_w;
  pVVar2 = VRLocation::getTreePredecessor(location);
  this = &pVVar2->relations;
  local_98 = &location->relations;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = lt;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar3 = ValueRelations::getEqual(this,lt);
  local_68 = (pVVar3->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_88 = this;
  local_78 = rt;
  for (ppVVar6 = (pVVar3->vec).
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar6 != local_68;
      ppVVar6 = ppVVar6 + 1) {
    local_a0 = *ppVVar6;
    iVar4 = std::
            _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
            ::find(&local_60,&local_a0);
    if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
      local_70 = ppVVar6;
      pVVar3 = ValueRelations::getEqual(this,rt);
      ppVVar1 = (pVVar3->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppVVar6 = (pVVar3->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; rt = local_78, this = local_88,
          ppVVar6 != ppVVar1; ppVVar6 = ppVVar6 + 1) {
        local_a8 = *ppVVar6;
        if ((local_a0 != local_a8) &&
           (_Var5._M_w = (_WordT)getCommon<llvm::Value_const*,llvm::Value_const*>
                                           (location,&local_a0,local_90._M_w,&local_a8),
           (_Base_bitset<1UL>)_Var5._M_w != (_Base_bitset<1UL>)0x0)) {
          if ((_Var5._M_w & 1) != 0) {
            std::
            _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
            ::_M_emplace_unique<llvm::Value_const*&>
                      ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                        *)&local_60,&local_a8);
          }
          ValueRelations::set<llvm::Value_const*,llvm::Value_const*>
                    (local_98,&local_a0,(Relations)_Var5._M_w,&local_a8);
        }
      }
      local_a8 = (Value *)ValueRelations::getBorderId(local_88,local_78);
      ppVVar6 = local_70;
      if ((local_a8 != (Value *)0xffffffffffffffff) &&
         (_Var5._M_w = (_WordT)getCommon<llvm::Value_const*,unsigned_long>
                                         (location,&local_a0,local_90._M_w,
                                          (unsigned_long *)&local_a8), ppVVar6 = local_70,
         (_Base_bitset<1UL>)_Var5._M_w != (_Base_bitset<1UL>)0x0)) {
        ValueRelations::set<llvm::Value_const*,unsigned_long>
                  (local_98,&local_a0,(Relations)_Var5._M_w,(unsigned_long *)&local_a8);
        ppVVar6 = local_70;
      }
    }
  }
  local_a0 = (Value *)ValueRelations::getBorderId(this,local_80);
  if (local_a0 != (key_type)0xffffffffffffffff) {
    pVVar3 = ValueRelations::getEqual(this,rt);
    ppVVar1 = (pVVar3->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar6 = (pVVar3->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVVar6 != ppVVar1;
        ppVVar6 = ppVVar6 + 1) {
      local_a8 = *ppVVar6;
      _Var5._M_w = (_WordT)getCommon<unsigned_long,llvm::Value_const*>
                                     (location,(unsigned_long *)&local_a0,local_90._M_w,&local_a8);
      if ((_Base_bitset<1UL>)_Var5._M_w != (_Base_bitset<1UL>)0x0) {
        ValueRelations::set<unsigned_long,llvm::Value_const*>
                  (local_98,(unsigned_long *)&local_a0,(Relations)_Var5._M_w,&local_a8);
      }
    }
    local_a8 = (Value *)ValueRelations::getBorderId(local_88,rt);
    if ((local_a8 != (Value *)0xffffffffffffffff) &&
       (_Var5._M_w = (_WordT)getCommon<unsigned_long,unsigned_long>
                                       (location,(unsigned_long *)&local_a0,local_90._M_w,
                                        (unsigned_long *)&local_a8),
       (_Base_bitset<1UL>)_Var5._M_w != (_Base_bitset<1UL>)0x0)) {
      ValueRelations::set<unsigned_long,unsigned_long>
                (local_98,(unsigned_long *)&local_a0,(Relations)_Var5._M_w,
                 (unsigned_long *)&local_a8);
    }
  }
  std::
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void RelationsAnalyzer::inferFromPreds(VRLocation &location, Handle lt,
                                       Relations known, Handle rt) {
    const ValueRelations &predGraph = location.getTreePredecessor().relations;
    ValueRelations &newGraph = location.relations;

    std::set<V> setEqual;
    for (const auto *ltVal : predGraph.getEqual(lt)) {
        if (setEqual.find(ltVal) != setEqual.end())
            continue;
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            if (ltVal == rtVal)
                continue;

            Relations related = getCommon(location, ltVal, known, rtVal);
            if (!related.any())
                continue;

            if (related.has(Relations::EQ))
                setEqual.emplace(rtVal);
            newGraph.set(ltVal, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltVal, known, rtId);
            if (!related.any())
                continue;

            newGraph.set(ltVal, related, rtId);
        }
    }

    size_t ltId = predGraph.getBorderId(lt);
    if (ltId != std::string::npos) {
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            Relations related = getCommon(location, ltId, known, rtVal);
            if (!related.any())
                continue;

            newGraph.set(ltId, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltId, known, rtId);
            if (!related.any())
                return;

            newGraph.set(ltId, related, rtId);
        }
    }
}